

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O1

uint32_t __thiscall Instance::makespan(Instance *this)

{
  pointer ppEVar1;
  Edge *pEVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  pointer pTVar6;
  ulong uVar7;
  pointer ppEVar8;
  bool bVar9;
  expr eVar10;
  model m;
  Train train;
  ast local_c8;
  pointer local_b8;
  pointer local_b0;
  ast local_a8;
  model local_98;
  ulong local_88;
  undefined8 uStack_80;
  ulong uStack_78;
  Edge *pEStack_70;
  vector<Stop,_std::allocator<Stop>_> local_68;
  vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
  local_50;
  
  z3::optimize::get_model((optimize *)&local_98);
  pTVar6 = (this->trains).super__Vector_base<Train,_std::allocator<Train>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_b8 = (this->trains).super__Vector_base<Train,_std::allocator<Train>_>._M_impl.
             super__Vector_impl_data._M_finish;
  uVar5 = 0;
  if (pTVar6 != local_b8) {
    do {
      local_88._0_4_ = pTVar6->id;
      local_88._4_4_ = pTVar6->speed;
      uStack_80 = *(undefined8 *)&pTVar6->length;
      uStack_78 = *(ulong *)&pTVar6->start;
      pEStack_70 = (pTVar6->start).stopEdge;
      std::vector<Stop,_std::allocator<Stop>_>::vector(&local_68,&pTVar6->stops);
      std::
      vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
      ::vector(&local_50,&pTVar6->paths);
      local_b0 = pTVar6;
      if (this->maxTimeSteps == 0) {
        uVar4 = 0;
      }
      else {
        uVar7 = 0;
        bVar9 = false;
        uVar4 = 0;
        do {
          if (((uStack_78 & 0xffffffff) <= uVar7) && (!bVar9)) {
            uVar4 = uVar4 + 1;
            ppEVar8 = (this->graph).edges.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            ppEVar1 = (this->graph).edges.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            if (ppEVar8 != ppEVar1) {
              do {
                pEVar2 = *ppEVar8;
                z3::ast_vector_tpl<z3::expr>::operator[]
                          ((ast_vector_tpl<z3::expr> *)&local_a8,
                           (int)(this->occupiedVars).
                                super__Vector_base<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>,_std::allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[local_88 & 0xffffffff].
                                super__Vector_base<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + (int)(uVar7 << 4));
                eVar10 = z3::model::eval((model *)&local_c8,(expr *)&local_98,SUB81(&local_a8,0));
                iVar3 = Z3_get_bool_value((local_c8.super_object.m_ctx)->m_ctx,local_c8.m_ast,
                                          eVar10.super_ast.m_ast);
                z3::ast::~ast(&local_c8);
                z3::ast::~ast(&local_a8);
                if (iVar3 == 1) {
                  bVar9 = pEVar2 == local_68.super__Vector_base<Stop,_std::allocator<Stop>_>._M_impl
                                    .super__Vector_impl_data._M_finish[-1].stopEdge;
                }
                ppEVar8 = ppEVar8 + 1;
              } while (ppEVar8 != ppEVar1);
            }
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 < this->maxTimeSteps);
      }
      if (uVar5 < uVar4) {
        uVar5 = uVar4;
      }
      std::
      vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
      ::~vector(&local_50);
      if (local_68.super__Vector_base<Stop,_std::allocator<Stop>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_68.super__Vector_base<Stop,_std::allocator<Stop>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68.super__Vector_base<Stop,_std::allocator<Stop>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.super__Vector_base<Stop,_std::allocator<Stop>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      pTVar6 = local_b0 + 1;
    } while (pTVar6 != local_b8);
  }
  z3::model::~model(&local_98);
  return uVar5;
}

Assistant:

uint32_t Instance::makespan() {
  model m = solver.get_model();
  uint32_t make_span = 0;
  for (Train train : trains) {
    uint32_t travel_time = 0;
    bool reachedGoal = false;
    for (size_t time = 0; time < maxTimeSteps; time++) {
      if(time < train.start.arrivalTime || reachedGoal){
        continue;
      }
      travel_time++;
      for (Edge *edge : graph.edges) {
        if (m.eval(occupiedVars[train.id][time][edge->id], false)
                .bool_value() == Z3_TRUE) {
          reachedGoal = edge == train.stops.back().stopEdge;
        }
      }
    }
    if(travel_time > make_span)
      make_span = travel_time;
  }
  return make_span;
}